

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

Cnf_Dat_t * Acb_NtkWindow2Cnf(Acb_Ntk_t *p,Vec_Int_t *vWinObjs,int Pivot)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *p_01;
  Vec_Int_t *vLits;
  Cnf_Dat_t *pCVar7;
  int **ppiVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  char *__assertion;
  long lVar16;
  uint uVar17;
  long local_70;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  p_00->pArray = piVar5;
  if (Pivot < 0) {
LAB_003a1366:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_70 = 0xffffffff;
  lVar10 = local_70;
  if (0 < (long)vWinObjs->nSize) {
    lVar9 = 0;
    do {
      lVar10 = lVar9;
      if (vWinObjs->pArray[lVar9] == Pivot * 2) break;
      lVar9 = lVar9 + 1;
      lVar10 = local_70;
    } while (vWinObjs->nSize != lVar9);
  }
  local_70 = lVar10;
  iVar13 = (int)local_70;
  iVar2 = Acb_NtkCountRoots(vWinObjs,iVar13);
  iVar4 = vWinObjs->nSize;
  pVVar6 = Acb_DeriveCnfForWindow(p,vWinObjs,iVar13);
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_01->pArray = piVar5;
  vLits = (Vec_Int_t *)malloc(0x10);
  vLits->nCap = 1000;
  vLits->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vLits->pArray = piVar5;
  if (0 < vWinObjs->nSize) {
    piVar5 = vWinObjs->pArray;
    lVar10 = 0;
    do {
      uVar12 = piVar5[lVar10];
      if ((int)uVar12 < 0) goto LAB_003a1385;
      if (uVar12 < 2) goto LAB_003a1328;
      iVar15 = (p->vObjFunc).nSize;
      if (iVar15 < 1) goto LAB_003a131f;
      uVar12 = uVar12 >> 1;
      if (iVar15 <= (int)uVar12) goto LAB_003a1300;
      piVar1 = (p->vObjFunc).pArray;
      if (piVar1[uVar12] != -1) {
        __assert_fail("Acb_ObjFunc(p, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x11b,"void Acb_ObjSetFunc(Acb_Ntk_t *, int, int)");
      }
      piVar1[uVar12] = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vWinObjs->nSize);
  }
  Vec_IntPush(p_01,0);
  if (0 < vWinObjs->nSize) {
    lVar10 = 0;
    do {
      uVar12 = vWinObjs->pArray[lVar10];
      if ((int)uVar12 < 0) goto LAB_003a13a4;
      if ((iVar13 <= lVar10) || ((uVar12 & 1) == 0)) {
        if (uVar12 < 2) goto LAB_003a13e2;
        uVar12 = uVar12 >> 1;
        if ((p->vObjType).nSize <= (int)uVar12) goto LAB_003a13c3;
        if (0xfd < (byte)((p->vObjType).pArray[uVar12] - 5U)) {
          __assert_fail("!Acb_ObjIsCio(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                        ,0xd5,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
        }
        p_00->nSize = 0;
        if ((p->vObjFans).nSize <= (int)uVar12) goto LAB_003a1300;
        iVar15 = (p->vObjFans).pArray[uVar12];
        lVar9 = (long)iVar15;
        if ((lVar9 < 0) || ((p->vFanSto).nSize <= iVar15)) goto LAB_003a1347;
        piVar5 = (p->vFanSto).pArray;
        if (0 < piVar5[lVar9]) {
          lVar16 = 0;
          do {
            iVar15 = piVar5[lVar9 + lVar16 + 1];
            if ((long)iVar15 < 1) goto LAB_003a1328;
            iVar3 = (p->vObjFunc).nSize;
            if (iVar3 < 1) goto LAB_003a131f;
            if (iVar3 <= iVar15) goto LAB_003a1300;
            lVar16 = lVar16 + 1;
            Vec_IntPush(p_00,(p->vObjFunc).pArray[iVar15]);
          } while (lVar16 < piVar5[lVar9]);
        }
        iVar15 = (p->vObjFunc).nSize;
        if (iVar15 < 1) goto LAB_003a131f;
        if (iVar15 <= (int)uVar12) goto LAB_003a1300;
        Vec_IntPush(p_00,(p->vObjFunc).pArray[uVar12]);
        if (pVVar6->nSize <= (int)uVar12) goto LAB_003a1401;
        Acb_TranslateCnf(p_01,vLits,(Vec_Str_t *)(pVVar6->pArray + uVar12),p_00,-1);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vWinObjs->nSize);
  }
  uVar12 = iVar13 + 1;
  iVar3 = iVar4 - uVar12;
  iVar15 = vWinObjs->nSize;
  if ((int)uVar12 < iVar15) {
    uVar11 = (ulong)uVar12;
    do {
      uVar17 = vWinObjs->pArray[uVar11];
      if ((int)uVar17 < 0) {
LAB_003a1385:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (uVar17 < 2) {
LAB_003a13e2:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      uVar17 = uVar17 >> 1;
      if ((p->vObjType).nSize <= (int)uVar17) {
LAB_003a13c3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (0xfd < (byte)((p->vObjType).pArray[uVar17] - 5U)) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0xe2,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
      }
      p_00->nSize = 0;
      if ((p->vObjFans).nSize <= (int)uVar17) goto LAB_003a1300;
      iVar15 = (p->vObjFans).pArray[uVar17];
      lVar10 = (long)iVar15;
      if ((lVar10 < 0) || ((p->vFanSto).nSize <= iVar15)) {
LAB_003a1347:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar5 = (p->vFanSto).pArray;
      if (0 < piVar5[lVar10]) {
        lVar9 = 0;
        do {
          iVar15 = piVar5[lVar10 + lVar9 + 1];
          if ((long)iVar15 < 1) goto LAB_003a1328;
          iVar14 = (p->vObjFunc).nSize;
          if (iVar14 < 1) goto LAB_003a131f;
          if (iVar14 <= iVar15) goto LAB_003a1300;
          lVar9 = lVar9 + 1;
          iVar15 = (p->vObjFunc).pArray[iVar15];
          iVar14 = 0;
          if (iVar13 < iVar15) {
            iVar14 = iVar3;
          }
          Vec_IntPush(p_00,iVar14 + iVar15);
        } while (lVar9 < piVar5[lVar10]);
      }
      iVar15 = (p->vObjFunc).nSize;
      if (iVar15 < 1) goto LAB_003a131f;
      if (iVar15 <= (int)uVar17) goto LAB_003a1300;
      Vec_IntPush(p_00,(p->vObjFunc).pArray[uVar17] + iVar3);
      if (pVVar6->nSize <= (int)uVar17) {
LAB_003a1401:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Acb_TranslateCnf(p_01,vLits,(Vec_Str_t *)(pVVar6->pArray + uVar17),p_00,iVar13);
      uVar11 = uVar11 + 1;
      iVar15 = vWinObjs->nSize;
    } while ((int)uVar11 < iVar15);
  }
  iVar4 = iVar4 + iVar2 + iVar3;
  if (0 < iVar2) {
    iVar15 = iVar15 + iVar3;
    p_00->nSize = 0;
    if ((int)uVar12 < vWinObjs->nSize) {
      uVar11 = (ulong)uVar12;
      do {
        uVar12 = vWinObjs->pArray[uVar11];
        if ((int)uVar12 < 0) {
LAB_003a13a4:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar12 & 1) != 0) {
          if (uVar12 < 2) goto LAB_003a1328;
          iVar13 = (p->vObjFunc).nSize;
          if (iVar13 < 1) goto LAB_003a131f;
          uVar12 = uVar12 >> 1;
          if (iVar13 <= (int)uVar12) {
LAB_003a1300:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar13 = (p->vObjFunc).pArray[uVar12];
          if (((iVar13 < 0) || (iVar13 + iVar3 < 0)) || (iVar15 < 0)) goto LAB_003a1366;
          uVar17 = iVar15 * 2;
          Vec_IntPush(vLits,iVar13 * 2 + 1);
          Vec_IntPush(vLits,(iVar13 + iVar3) * 2);
          Vec_IntPush(vLits,uVar17);
          Vec_IntPush(p_01,vLits->nSize);
          iVar13 = (p->vObjFunc).nSize;
          if (iVar13 < 1) goto LAB_003a131f;
          if (iVar13 <= (int)uVar12) goto LAB_003a1300;
          iVar13 = (p->vObjFunc).pArray[uVar12];
          if ((iVar13 < 0) || (iVar13 + iVar3 < 0)) goto LAB_003a1366;
          Vec_IntPush(vLits,iVar13 * 2);
          Vec_IntPush(vLits,(iVar13 + iVar3) * 2 + 1);
          Vec_IntPush(vLits,uVar17);
          Vec_IntPush(p_01,vLits->nSize);
          iVar13 = (p->vObjFunc).nSize;
          if (iVar13 < 1) goto LAB_003a131f;
          if (iVar13 <= (int)uVar12) goto LAB_003a1300;
          iVar13 = (p->vObjFunc).pArray[uVar12];
          if ((iVar13 < 0) || (iVar13 + iVar3 < 0)) goto LAB_003a1366;
          Vec_IntPush(vLits,iVar13 * 2);
          Vec_IntPush(vLits,(iVar13 + iVar3) * 2);
          Vec_IntPush(vLits,uVar17 | 1);
          Vec_IntPush(p_01,vLits->nSize);
          iVar13 = (p->vObjFunc).nSize;
          if (iVar13 < 1) goto LAB_003a131f;
          if (iVar13 <= (int)uVar12) goto LAB_003a1300;
          iVar13 = (p->vObjFunc).pArray[uVar12];
          if ((iVar13 < 0) || (iVar13 + iVar3 < 0)) goto LAB_003a1366;
          Vec_IntPush(vLits,iVar13 * 2 + 1);
          Vec_IntPush(vLits,(iVar13 + iVar3) * 2 + 1);
          Vec_IntPush(vLits,uVar17 | 1);
          Vec_IntPush(p_01,vLits->nSize);
          iVar15 = iVar15 + 1;
          Vec_IntPush(p_00,uVar17);
        }
        uVar11 = uVar11 + 1;
      } while ((int)uVar11 < vWinObjs->nSize);
    }
    iVar13 = p_00->nSize;
    if (0 < (long)iVar13) {
      piVar5 = p_00->pArray;
      lVar10 = 0;
      do {
        Vec_IntPush(vLits,piVar5[lVar10]);
        lVar10 = lVar10 + 1;
      } while (iVar13 != lVar10);
    }
    Vec_IntPush(p_01,vLits->nSize);
    if (iVar2 != iVar13) {
      __assert_fail("nRoots == Vec_IntSize(vFaninVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x102,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
    if (iVar15 != iVar4) {
      __assert_fail("nVars == nVarsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x103,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pCVar7 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar7->nVars = iVar4;
  lVar10 = (long)p_01->nSize;
  pCVar7->nClauses = p_01->nSize + -1;
  pCVar7->nLiterals = vLits->nSize;
  ppiVar8 = (int **)malloc(lVar10 * 8);
  pCVar7->pClauses = ppiVar8;
  piVar5 = vLits->pArray;
  vLits->nCap = 0;
  vLits->nSize = 0;
  vLits->pArray = (int *)0x0;
  *ppiVar8 = piVar5;
  if (0 < lVar10) {
    piVar5 = p_01->pArray;
    lVar9 = 0;
    do {
      ppiVar8[lVar9] = *ppiVar8 + piVar5[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (vLits->pArray != (int *)0x0) {
    free(vLits->pArray);
    vLits->pArray = (int *)0x0;
  }
  free(vLits);
  return pCVar7;
LAB_003a1328:
  __assertion = "i>0";
  goto LAB_003a132f;
LAB_003a131f:
  __assertion = "Acb_NtkHasObjFuncs(p)";
LAB_003a132f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
}

Assistant:

Cnf_Dat_t * Acb_NtkWindow2Cnf( Acb_Ntk_t * p, Vec_Int_t * vWinObjs, int Pivot )
{
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vFaninVars = Vec_IntAlloc( 8 );
    int PivotVar = Vec_IntFind(vWinObjs, Abc_Var2Lit(Pivot, 0));
    int nRoots   = Acb_NtkCountRoots(vWinObjs, PivotVar);
    int TfoStart = PivotVar + 1;
    int nTfoSize = Vec_IntSize(vWinObjs) - TfoStart;
    int nVarsAll = Vec_IntSize(vWinObjs) + nTfoSize + nRoots;
    int i, k, iObj, iObjLit, iFanin, * pFanins, Entry;
    Vec_Wec_t * vCnfs = Acb_DeriveCnfForWindow( p, vWinObjs, PivotVar );
    Vec_Int_t * vClas = Vec_IntAlloc( 100 );
    Vec_Int_t * vLits = Vec_IntAlloc( 1000 );
    // mark new SAT variables
    Vec_IntForEachEntry( vWinObjs, iObj, i )
        Acb_ObjSetFunc( p, Abc_Lit2Var(iObj), i );
    // add clauses for all nodes
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    Vec_IntForEachEntry( vWinObjs, iObjLit, i )
    {
        if ( Abc_LitIsCompl(iObjLit) && i < PivotVar )
            continue;
        iObj = Abc_Lit2Var(iObjLit);
        assert( !Acb_ObjIsCio(p, iObj) );
        // collect SAT variables
        Vec_IntClear( vFaninVars );
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iObj) );
        // derive CNF for the node
        Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, -1 );
    }
    // add second clauses for the TFO
    Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, TfoStart )
    {
        iObj = Abc_Lit2Var(iObjLit);
        assert( !Acb_ObjIsCio(p, iObj) );
        // collect SAT variables
        Vec_IntClear( vFaninVars );
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) + (Acb_ObjFunc(p, iFanin) > PivotVar) * nTfoSize );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iObj) + nTfoSize );
        // derive CNF for the node
        Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, PivotVar );
    }
    if ( nRoots > 0 )
    {
        // create XOR clauses for the roots
        int nVars = Vec_IntSize(vWinObjs) + nTfoSize;
        Vec_IntClear( vFaninVars );
        Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, TfoStart )
        {
            if ( !Abc_LitIsCompl(iObjLit) )
                continue;
            iObj = Abc_Lit2Var(iObjLit);
            // add clauses
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 1), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 0), Abc_Var2Lit(nVars, 0) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 0), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 1), Abc_Var2Lit(nVars, 0) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 0), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 0), Abc_Var2Lit(nVars, 1) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 1), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 1), Abc_Var2Lit(nVars, 1) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vFaninVars, Abc_Var2Lit(nVars++, 0) );
        }
        Vec_IntAppend( vLits, vFaninVars );
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        assert( nRoots == Vec_IntSize(vFaninVars) );
        assert( nVars == nVarsAll );
    }
    Vec_IntFree( vFaninVars );
    // create CNF structure
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVarsAll;
    pCnf->nClauses  = Vec_IntSize(vClas)-1;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    // cleanup
    Vec_IntFree( vClas );
    Vec_IntFree( vLits );
    //Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}